

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  RTCFilterFunctionN p_Var3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  ulong uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  int iVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  Geometry *pGVar16;
  ulong uVar17;
  ulong *puVar18;
  Scene *pSVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  float fVar42;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar58;
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [64];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  float fVar75;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar110 [64];
  undefined1 auVar111 [16];
  undefined1 auVar112 [64];
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar117 [16];
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_16b9;
  ulong *local_16b8;
  undefined8 local_16b0;
  float fStack_16a8;
  float fStack_16a4;
  undefined1 local_16a0 [16];
  undefined1 local_1690 [16];
  undefined1 local_1680 [16];
  undefined1 local_1670 [16];
  undefined1 local_1660 [16];
  undefined1 local_1650 [16];
  Scene *local_1640;
  undefined8 uStack_1638;
  undefined1 local_1630 [16];
  undefined1 local_1620 [16];
  long local_1608;
  long local_1600;
  ulong local_15f8;
  RTCFilterFunctionNArguments local_15f0;
  undefined1 local_15c0 [32];
  undefined1 local_1590 [16];
  undefined1 local_1580 [16];
  undefined1 local_1570 [16];
  undefined1 local_1560 [16];
  float local_1550;
  float fStack_154c;
  float fStack_1548;
  float fStack_1544;
  undefined1 local_1540 [16];
  undefined1 local_1530 [16];
  undefined1 *local_1520;
  undefined1 local_1510 [16];
  undefined1 local_1500 [16];
  undefined1 local_14f0 [16];
  undefined1 local_14e0 [16];
  undefined1 local_14d0 [16];
  undefined1 local_14c0 [16];
  undefined1 local_14b0 [16];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  float local_1440;
  float fStack_143c;
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  float fStack_1424;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  RTCHitN local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined4 local_12c0;
  undefined4 uStack_12bc;
  undefined4 uStack_12b8;
  undefined4 uStack_12b4;
  undefined4 uStack_12b0;
  undefined4 uStack_12ac;
  undefined4 uStack_12a8;
  undefined4 uStack_12a4;
  undefined4 local_12a0;
  undefined4 uStack_129c;
  undefined4 uStack_1298;
  undefined4 uStack_1294;
  undefined4 uStack_1290;
  undefined4 uStack_128c;
  undefined4 uStack_1288;
  undefined4 uStack_1284;
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  uint local_1240;
  uint uStack_123c;
  uint uStack_1238;
  uint uStack_1234;
  uint uStack_1230;
  uint uStack_122c;
  uint uStack_1228;
  uint uStack_1224;
  uint local_1220;
  uint uStack_121c;
  uint uStack_1218;
  uint uStack_1214;
  uint uStack_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1340._4_4_ = uVar1;
  local_1340._0_4_ = uVar1;
  local_1340._8_4_ = uVar1;
  local_1340._12_4_ = uVar1;
  local_1340._16_4_ = uVar1;
  local_1340._20_4_ = uVar1;
  local_1340._24_4_ = uVar1;
  local_1340._28_4_ = uVar1;
  auVar65 = ZEXT3264(local_1340);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1360._4_4_ = uVar1;
  local_1360._0_4_ = uVar1;
  local_1360._8_4_ = uVar1;
  local_1360._12_4_ = uVar1;
  local_1360._16_4_ = uVar1;
  local_1360._20_4_ = uVar1;
  local_1360._24_4_ = uVar1;
  local_1360._28_4_ = uVar1;
  auVar72 = ZEXT3264(local_1360);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1380._4_4_ = uVar1;
  local_1380._0_4_ = uVar1;
  local_1380._8_4_ = uVar1;
  local_1380._12_4_ = uVar1;
  local_1380._16_4_ = uVar1;
  local_1380._20_4_ = uVar1;
  local_1380._24_4_ = uVar1;
  local_1380._28_4_ = uVar1;
  auVar74 = ZEXT3264(local_1380);
  fVar93 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar103 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar42 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar75 = fVar93 * 0.99999964;
  fVar52 = fVar103 * 0.99999964;
  fVar86 = fVar42 * 0.99999964;
  fVar93 = fVar93 * 1.0000004;
  fVar103 = fVar103 * 1.0000004;
  fVar42 = fVar42 * 1.0000004;
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_15f8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar15 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar23 = uVar20 ^ 0x20;
  uVar21 = local_15f8 ^ 0x20;
  iVar11 = (tray->tnear).field_0.i[k];
  local_1460._4_4_ = iVar11;
  local_1460._0_4_ = iVar11;
  local_1460._8_4_ = iVar11;
  local_1460._12_4_ = iVar11;
  local_1460._16_4_ = iVar11;
  local_1460._20_4_ = iVar11;
  local_1460._24_4_ = iVar11;
  local_1460._28_4_ = iVar11;
  auVar110 = ZEXT3264(local_1460);
  iVar11 = (tray->tfar).field_0.i[k];
  local_1480._4_4_ = iVar11;
  local_1480._0_4_ = iVar11;
  local_1480._8_4_ = iVar11;
  local_1480._12_4_ = iVar11;
  local_1480._16_4_ = iVar11;
  local_1480._20_4_ = iVar11;
  local_1480._24_4_ = iVar11;
  local_1480._28_4_ = iVar11;
  auVar112 = ZEXT3264(local_1480);
  iVar11 = 1 << ((uint)k & 0x1f);
  auVar30._4_4_ = iVar11;
  auVar30._0_4_ = iVar11;
  auVar30._8_4_ = iVar11;
  auVar30._12_4_ = iVar11;
  auVar30._16_4_ = iVar11;
  auVar30._20_4_ = iVar11;
  auVar30._24_4_ = iVar11;
  auVar30._28_4_ = iVar11;
  auVar5 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar30 = vpand_avx2(auVar30,auVar5);
  local_14a0 = vpcmpeqd_avx2(auVar30,auVar5);
  local_13a0 = fVar75;
  fStack_139c = fVar75;
  fStack_1398 = fVar75;
  fStack_1394 = fVar75;
  fStack_1390 = fVar75;
  fStack_138c = fVar75;
  fStack_1388 = fVar75;
  fStack_1384 = fVar75;
  local_13c0 = fVar52;
  fStack_13bc = fVar52;
  fStack_13b8 = fVar52;
  fStack_13b4 = fVar52;
  fStack_13b0 = fVar52;
  fStack_13ac = fVar52;
  fStack_13a8 = fVar52;
  fStack_13a4 = fVar52;
  local_13e0 = fVar86;
  fStack_13dc = fVar86;
  fStack_13d8 = fVar86;
  fStack_13d4 = fVar86;
  fStack_13d0 = fVar86;
  fStack_13cc = fVar86;
  fStack_13c8 = fVar86;
  fStack_13c4 = fVar86;
  local_1400 = fVar93;
  fStack_13fc = fVar93;
  fStack_13f8 = fVar93;
  fStack_13f4 = fVar93;
  fStack_13f0 = fVar93;
  fStack_13ec = fVar93;
  fStack_13e8 = fVar93;
  fStack_13e4 = fVar93;
  local_1420 = fVar103;
  fStack_141c = fVar103;
  fStack_1418 = fVar103;
  fStack_1414 = fVar103;
  fStack_1410 = fVar103;
  fStack_140c = fVar103;
  fStack_1408 = fVar103;
  fStack_1404 = fVar103;
  local_1440 = fVar42;
  fStack_143c = fVar42;
  fStack_1438 = fVar42;
  fStack_1434 = fVar42;
  fStack_1430 = fVar42;
  fStack_142c = fVar42;
  fStack_1428 = fVar42;
  fStack_1424 = fVar42;
  local_16b8 = local_11f8;
  fVar46 = fVar42;
  fVar47 = fVar42;
  fVar48 = fVar42;
  fVar49 = fVar42;
  fVar50 = fVar42;
  fVar51 = fVar42;
  fVar113 = fVar52;
  fVar114 = fVar52;
  fVar115 = fVar52;
  fVar116 = fVar52;
  fVar58 = fVar52;
  fVar59 = fVar52;
  fVar80 = fVar75;
  fVar81 = fVar75;
  fVar82 = fVar75;
  fVar83 = fVar75;
  fVar84 = fVar75;
  fVar85 = fVar75;
  fVar87 = fVar86;
  fVar88 = fVar86;
  fVar89 = fVar86;
  fVar90 = fVar86;
  fVar91 = fVar86;
  fVar92 = fVar86;
  fVar97 = fVar93;
  fVar98 = fVar93;
  fVar99 = fVar93;
  fVar100 = fVar93;
  fVar101 = fVar93;
  fVar102 = fVar93;
  fVar104 = fVar103;
  fVar105 = fVar103;
  fVar106 = fVar103;
  fVar107 = fVar103;
  fVar108 = fVar103;
  fVar109 = fVar103;
LAB_016c63a9:
  do {
    puVar18 = local_16b8;
    if (puVar18 == &local_1200) {
LAB_016c6d23:
      return puVar18 != &local_1200;
    }
    local_16b8 = puVar18 + -1;
    uVar22 = puVar18[-1];
    while ((uVar22 & 8) == 0) {
      auVar30 = vsubps_avx(*(undefined1 (*) [32])(uVar22 + 0x40 + uVar20),auVar65._0_32_);
      auVar5._4_4_ = fVar80 * auVar30._4_4_;
      auVar5._0_4_ = fVar75 * auVar30._0_4_;
      auVar5._8_4_ = fVar81 * auVar30._8_4_;
      auVar5._12_4_ = fVar82 * auVar30._12_4_;
      auVar5._16_4_ = fVar83 * auVar30._16_4_;
      auVar5._20_4_ = fVar84 * auVar30._20_4_;
      auVar5._24_4_ = fVar85 * auVar30._24_4_;
      auVar5._28_4_ = auVar30._28_4_;
      auVar30 = vsubps_avx(*(undefined1 (*) [32])(uVar22 + 0x40 + local_15f8),auVar72._0_32_);
      auVar4._4_4_ = fVar113 * auVar30._4_4_;
      auVar4._0_4_ = fVar52 * auVar30._0_4_;
      auVar4._8_4_ = fVar114 * auVar30._8_4_;
      auVar4._12_4_ = fVar115 * auVar30._12_4_;
      auVar4._16_4_ = fVar116 * auVar30._16_4_;
      auVar4._20_4_ = fVar58 * auVar30._20_4_;
      auVar4._24_4_ = fVar59 * auVar30._24_4_;
      auVar4._28_4_ = auVar30._28_4_;
      auVar30 = vmaxps_avx(auVar5,auVar4);
      auVar5 = vsubps_avx(*(undefined1 (*) [32])(uVar22 + 0x40 + uVar15),auVar74._0_32_);
      auVar7._4_4_ = fVar87 * auVar5._4_4_;
      auVar7._0_4_ = fVar86 * auVar5._0_4_;
      auVar7._8_4_ = fVar88 * auVar5._8_4_;
      auVar7._12_4_ = fVar89 * auVar5._12_4_;
      auVar7._16_4_ = fVar90 * auVar5._16_4_;
      auVar7._20_4_ = fVar91 * auVar5._20_4_;
      auVar7._24_4_ = fVar92 * auVar5._24_4_;
      auVar7._28_4_ = auVar5._28_4_;
      auVar5 = vmaxps_avx(auVar7,auVar110._0_32_);
      auVar30 = vmaxps_avx(auVar30,auVar5);
      auVar5 = vsubps_avx(*(undefined1 (*) [32])(uVar22 + 0x40 + uVar23),auVar65._0_32_);
      auVar8._4_4_ = fVar97 * auVar5._4_4_;
      auVar8._0_4_ = fVar93 * auVar5._0_4_;
      auVar8._8_4_ = fVar98 * auVar5._8_4_;
      auVar8._12_4_ = fVar99 * auVar5._12_4_;
      auVar8._16_4_ = fVar100 * auVar5._16_4_;
      auVar8._20_4_ = fVar101 * auVar5._20_4_;
      auVar8._24_4_ = fVar102 * auVar5._24_4_;
      auVar8._28_4_ = auVar5._28_4_;
      auVar5 = vsubps_avx(*(undefined1 (*) [32])(uVar22 + 0x40 + uVar21),auVar72._0_32_);
      auVar9._4_4_ = fVar104 * auVar5._4_4_;
      auVar9._0_4_ = fVar103 * auVar5._0_4_;
      auVar9._8_4_ = fVar105 * auVar5._8_4_;
      auVar9._12_4_ = fVar106 * auVar5._12_4_;
      auVar9._16_4_ = fVar107 * auVar5._16_4_;
      auVar9._20_4_ = fVar108 * auVar5._20_4_;
      auVar9._24_4_ = fVar109 * auVar5._24_4_;
      auVar9._28_4_ = auVar5._28_4_;
      auVar5 = vminps_avx(auVar8,auVar9);
      auVar4 = vsubps_avx(*(undefined1 (*) [32])(uVar22 + 0x40 + (uVar15 ^ 0x20)),auVar74._0_32_);
      auVar10._4_4_ = fVar46 * auVar4._4_4_;
      auVar10._0_4_ = fVar42 * auVar4._0_4_;
      auVar10._8_4_ = fVar47 * auVar4._8_4_;
      auVar10._12_4_ = fVar48 * auVar4._12_4_;
      auVar10._16_4_ = fVar49 * auVar4._16_4_;
      auVar10._20_4_ = fVar50 * auVar4._20_4_;
      auVar10._24_4_ = fVar51 * auVar4._24_4_;
      auVar10._28_4_ = auVar4._28_4_;
      auVar4 = vminps_avx(auVar10,auVar112._0_32_);
      auVar5 = vminps_avx(auVar5,auVar4);
      auVar30 = vcmpps_avx(auVar30,auVar5,2);
      uVar12 = vmovmskps_avx(auVar30);
      if (uVar12 == 0) goto LAB_016c63a9;
      uVar12 = uVar12 & 0xff;
      uVar13 = uVar22 & 0xfffffffffffffff0;
      lVar14 = 0;
      for (uVar22 = (ulong)uVar12; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
        lVar14 = lVar14 + 1;
      }
      uVar22 = *(ulong *)(uVar13 + lVar14 * 8);
      uVar12 = uVar12 - 1 & uVar12;
      uVar17 = (ulong)uVar12;
      if (uVar12 != 0) {
        do {
          *local_16b8 = uVar22;
          local_16b8 = local_16b8 + 1;
          lVar14 = 0;
          for (uVar22 = uVar17; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
            lVar14 = lVar14 + 1;
          }
          uVar17 = uVar17 - 1 & uVar17;
          uVar22 = *(ulong *)(uVar13 + lVar14 * 8);
        } while (uVar17 != 0);
      }
    }
    local_1600 = (ulong)((uint)uVar22 & 0xf) - 8;
    uVar22 = uVar22 & 0xfffffffffffffff0;
    for (local_1608 = 0; local_1608 != local_1600; local_1608 = local_1608 + 1) {
      lVar14 = local_1608 * 0xb0;
      uVar1 = *(undefined4 *)(ray + k * 4);
      auVar24._4_4_ = uVar1;
      auVar24._0_4_ = uVar1;
      auVar24._8_4_ = uVar1;
      auVar24._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar35._4_4_ = uVar1;
      auVar35._0_4_ = uVar1;
      auVar35._8_4_ = uVar1;
      auVar35._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar43._4_4_ = uVar1;
      auVar43._0_4_ = uVar1;
      auVar43._8_4_ = uVar1;
      auVar43._12_4_ = uVar1;
      local_1620 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + lVar14),auVar24);
      local_1630 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x10 + lVar14),auVar35);
      local_1650 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x20 + lVar14),auVar43);
      auVar31 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x30 + lVar14),auVar24);
      auVar61 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x40 + lVar14),auVar35);
      auVar32 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x50 + lVar14),auVar43);
      auVar24 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x60 + lVar14),auVar24);
      auVar35 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x70 + lVar14),auVar35);
      auVar37 = vsubps_avx(*(undefined1 (*) [16])(uVar22 + 0x80 + lVar14),auVar43);
      local_1660 = vsubps_avx(auVar24,local_1620);
      local_1680 = vsubps_avx(auVar35,local_1630);
      local_1670 = vsubps_avx(auVar37,local_1650);
      auVar25._0_4_ = local_1620._0_4_ + auVar24._0_4_;
      auVar25._4_4_ = local_1620._4_4_ + auVar24._4_4_;
      auVar25._8_4_ = local_1620._8_4_ + auVar24._8_4_;
      auVar25._12_4_ = local_1620._12_4_ + auVar24._12_4_;
      auVar44._0_4_ = local_1630._0_4_ + auVar35._0_4_;
      auVar44._4_4_ = local_1630._4_4_ + auVar35._4_4_;
      auVar44._8_4_ = local_1630._8_4_ + auVar35._8_4_;
      auVar44._12_4_ = local_1630._12_4_ + auVar35._12_4_;
      fVar113 = local_1650._0_4_;
      auVar53._0_4_ = fVar113 + auVar37._0_4_;
      fVar114 = local_1650._4_4_;
      auVar53._4_4_ = fVar114 + auVar37._4_4_;
      fVar115 = local_1650._8_4_;
      auVar53._8_4_ = fVar115 + auVar37._8_4_;
      fVar116 = local_1650._12_4_;
      auVar53._12_4_ = fVar116 + auVar37._12_4_;
      auVar111._0_4_ = local_1670._0_4_ * auVar44._0_4_;
      auVar111._4_4_ = local_1670._4_4_ * auVar44._4_4_;
      auVar111._8_4_ = local_1670._8_4_ * auVar44._8_4_;
      auVar111._12_4_ = local_1670._12_4_ * auVar44._12_4_;
      auVar55 = vfmsub231ps_fma(auVar111,local_1680,auVar53);
      auVar54._0_4_ = auVar53._0_4_ * local_1660._0_4_;
      auVar54._4_4_ = auVar53._4_4_ * local_1660._4_4_;
      auVar54._8_4_ = auVar53._8_4_ * local_1660._8_4_;
      auVar54._12_4_ = auVar53._12_4_ * local_1660._12_4_;
      auVar43 = vfmsub231ps_fma(auVar54,local_1670,auVar25);
      auVar26._0_4_ = local_1680._0_4_ * auVar25._0_4_;
      auVar26._4_4_ = local_1680._4_4_ * auVar25._4_4_;
      auVar26._8_4_ = local_1680._8_4_ * auVar25._8_4_;
      auVar26._12_4_ = local_1680._12_4_ * auVar25._12_4_;
      auVar25 = vfmsub231ps_fma(auVar26,local_1660,auVar44);
      local_16b0._4_4_ = *(float *)(ray + k * 4 + 0xc0);
      auVar45._0_4_ = local_16b0._4_4_ * auVar25._0_4_;
      auVar45._4_4_ = local_16b0._4_4_ * auVar25._4_4_;
      auVar45._8_4_ = local_16b0._4_4_ * auVar25._8_4_;
      auVar45._12_4_ = local_16b0._4_4_ * auVar25._12_4_;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0xa0);
      auVar73._4_4_ = uVar1;
      auVar73._0_4_ = uVar1;
      auVar73._8_4_ = uVar1;
      auVar73._12_4_ = uVar1;
      auVar43 = vfmadd231ps_fma(auVar45,auVar73,auVar43);
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar117._4_4_ = uVar1;
      auVar117._0_4_ = uVar1;
      auVar117._8_4_ = uVar1;
      auVar117._12_4_ = uVar1;
      local_1580 = vfmadd231ps_fma(auVar43,auVar117,auVar55);
      auVar43 = vsubps_avx(local_1630,auVar61);
      local_1560 = vsubps_avx(local_1650,auVar32);
      auVar60._0_4_ = local_1630._0_4_ + auVar61._0_4_;
      auVar60._4_4_ = local_1630._4_4_ + auVar61._4_4_;
      auVar60._8_4_ = local_1630._8_4_ + auVar61._8_4_;
      auVar60._12_4_ = local_1630._12_4_ + auVar61._12_4_;
      auVar55._0_4_ = fVar113 + auVar32._0_4_;
      auVar55._4_4_ = fVar114 + auVar32._4_4_;
      auVar55._8_4_ = fVar115 + auVar32._8_4_;
      auVar55._12_4_ = fVar116 + auVar32._12_4_;
      fVar93 = local_1560._0_4_;
      auVar66._0_4_ = auVar60._0_4_ * fVar93;
      fVar75 = local_1560._4_4_;
      auVar66._4_4_ = auVar60._4_4_ * fVar75;
      fVar46 = local_1560._8_4_;
      auVar66._8_4_ = auVar60._8_4_ * fVar46;
      fVar49 = local_1560._12_4_;
      auVar66._12_4_ = auVar60._12_4_ * fVar49;
      auVar25 = vfmsub231ps_fma(auVar66,auVar43,auVar55);
      local_1570 = vsubps_avx(local_1620,auVar31);
      fVar103 = local_1570._0_4_;
      auVar76._0_4_ = auVar55._0_4_ * fVar103;
      fVar52 = local_1570._4_4_;
      auVar76._4_4_ = auVar55._4_4_ * fVar52;
      fVar47 = local_1570._8_4_;
      auVar76._8_4_ = auVar55._8_4_ * fVar47;
      fVar50 = local_1570._12_4_;
      auVar76._12_4_ = auVar55._12_4_ * fVar50;
      auVar56._0_4_ = local_1620._0_4_ + auVar31._0_4_;
      auVar56._4_4_ = local_1620._4_4_ + auVar31._4_4_;
      auVar56._8_4_ = local_1620._8_4_ + auVar31._8_4_;
      auVar56._12_4_ = local_1620._12_4_ + auVar31._12_4_;
      auVar55 = vfmsub231ps_fma(auVar76,local_1560,auVar56);
      fVar42 = auVar43._0_4_;
      auVar57._0_4_ = auVar56._0_4_ * fVar42;
      fVar86 = auVar43._4_4_;
      auVar57._4_4_ = auVar56._4_4_ * fVar86;
      fVar48 = auVar43._8_4_;
      auVar57._8_4_ = auVar56._8_4_ * fVar48;
      fVar51 = auVar43._12_4_;
      auVar57._12_4_ = auVar56._12_4_ * fVar51;
      auVar26 = vfmsub231ps_fma(auVar57,local_1570,auVar60);
      auVar27._0_4_ = local_16b0._4_4_ * auVar26._0_4_;
      auVar27._4_4_ = local_16b0._4_4_ * auVar26._4_4_;
      auVar27._8_4_ = local_16b0._4_4_ * auVar26._8_4_;
      auVar27._12_4_ = local_16b0._4_4_ * auVar26._12_4_;
      auVar55 = vfmadd231ps_fma(auVar27,auVar73,auVar55);
      local_1540 = vfmadd231ps_fma(auVar55,auVar117,auVar25);
      auVar55 = vsubps_avx(auVar31,auVar24);
      auVar67._0_4_ = auVar31._0_4_ + auVar24._0_4_;
      auVar67._4_4_ = auVar31._4_4_ + auVar24._4_4_;
      auVar67._8_4_ = auVar31._8_4_ + auVar24._8_4_;
      auVar67._12_4_ = auVar31._12_4_ + auVar24._12_4_;
      auVar24 = vsubps_avx(auVar61,auVar35);
      auVar36._0_4_ = auVar61._0_4_ + auVar35._0_4_;
      auVar36._4_4_ = auVar61._4_4_ + auVar35._4_4_;
      auVar36._8_4_ = auVar61._8_4_ + auVar35._8_4_;
      auVar36._12_4_ = auVar61._12_4_ + auVar35._12_4_;
      auVar35 = vsubps_avx(auVar32,auVar37);
      auVar31._0_4_ = auVar32._0_4_ + auVar37._0_4_;
      auVar31._4_4_ = auVar32._4_4_ + auVar37._4_4_;
      auVar31._8_4_ = auVar32._8_4_ + auVar37._8_4_;
      auVar31._12_4_ = auVar32._12_4_ + auVar37._12_4_;
      auVar61._0_4_ = auVar35._0_4_ * auVar36._0_4_;
      auVar61._4_4_ = auVar35._4_4_ * auVar36._4_4_;
      auVar61._8_4_ = auVar35._8_4_ * auVar36._8_4_;
      auVar61._12_4_ = auVar35._12_4_ * auVar36._12_4_;
      auVar61 = vfmsub231ps_fma(auVar61,auVar24,auVar31);
      auVar32._0_4_ = auVar31._0_4_ * auVar55._0_4_;
      auVar32._4_4_ = auVar31._4_4_ * auVar55._4_4_;
      auVar32._8_4_ = auVar31._8_4_ * auVar55._8_4_;
      auVar32._12_4_ = auVar31._12_4_ * auVar55._12_4_;
      auVar31 = vfmsub231ps_fma(auVar32,auVar35,auVar67);
      auVar68._0_4_ = auVar24._0_4_ * auVar67._0_4_;
      auVar68._4_4_ = auVar24._4_4_ * auVar67._4_4_;
      auVar68._8_4_ = auVar24._8_4_ * auVar67._8_4_;
      auVar68._12_4_ = auVar24._12_4_ * auVar67._12_4_;
      auVar32 = vfmsub231ps_fma(auVar68,auVar55,auVar36);
      local_16b0._0_4_ = local_16b0._4_4_;
      fStack_16a8 = local_16b0._4_4_;
      fStack_16a4 = local_16b0._4_4_;
      auVar37._0_4_ = local_16b0._4_4_ * auVar32._0_4_;
      auVar37._4_4_ = local_16b0._4_4_ * auVar32._4_4_;
      auVar37._8_4_ = local_16b0._4_4_ * auVar32._8_4_;
      auVar37._12_4_ = local_16b0._4_4_ * auVar32._12_4_;
      auVar31 = vfmadd231ps_fma(auVar37,auVar73,auVar31);
      auVar32 = vfmadd231ps_fma(auVar31,auVar117,auVar61);
      local_1550 = local_1580._0_4_;
      fStack_154c = local_1580._4_4_;
      fStack_1548 = local_1580._8_4_;
      fStack_1544 = local_1580._12_4_;
      local_1530._0_4_ = auVar32._0_4_ + local_1540._0_4_ + local_1550;
      local_1530._4_4_ = auVar32._4_4_ + local_1540._4_4_ + fStack_154c;
      local_1530._8_4_ = auVar32._8_4_ + local_1540._8_4_ + fStack_1548;
      local_1530._12_4_ = auVar32._12_4_ + local_1540._12_4_ + fStack_1544;
      auVar62._8_4_ = 0x7fffffff;
      auVar62._0_8_ = 0x7fffffff7fffffff;
      auVar62._12_4_ = 0x7fffffff;
      auVar31 = vminps_avx(local_1580,local_1540);
      auVar31 = vminps_avx(auVar31,auVar32);
      local_1590 = vandps_avx(local_1530,auVar62);
      auVar77._0_4_ = local_1590._0_4_ * 1.1920929e-07;
      auVar77._4_4_ = local_1590._4_4_ * 1.1920929e-07;
      auVar77._8_4_ = local_1590._8_4_ * 1.1920929e-07;
      auVar77._12_4_ = local_1590._12_4_ * 1.1920929e-07;
      uVar13 = CONCAT44(auVar77._4_4_,auVar77._0_4_);
      auVar69._0_8_ = uVar13 ^ 0x8000000080000000;
      auVar69._8_4_ = -auVar77._8_4_;
      auVar69._12_4_ = -auVar77._12_4_;
      auVar31 = vcmpps_avx(auVar31,auVar69,5);
      auVar61 = vmaxps_avx(local_1580,local_1540);
      auVar61 = vmaxps_avx(auVar61,auVar32);
      auVar61 = vcmpps_avx(auVar61,auVar77,2);
      local_16a0 = vorps_avx(auVar31,auVar61);
      if ((((local_16a0 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (local_16a0 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (local_16a0 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          local_16a0[0xf] < '\0') {
        auVar33._0_4_ = fVar42 * local_1670._0_4_;
        auVar33._4_4_ = fVar86 * local_1670._4_4_;
        auVar33._8_4_ = fVar48 * local_1670._8_4_;
        auVar33._12_4_ = fVar51 * local_1670._12_4_;
        auVar70._0_4_ = fVar103 * local_1680._0_4_;
        auVar70._4_4_ = fVar52 * local_1680._4_4_;
        auVar70._8_4_ = fVar47 * local_1680._8_4_;
        auVar70._12_4_ = fVar50 * local_1680._12_4_;
        auVar32 = vfmsub213ps_fma(local_1680,local_1560,auVar33);
        auVar38._0_4_ = auVar24._0_4_ * fVar93;
        auVar38._4_4_ = auVar24._4_4_ * fVar75;
        auVar38._8_4_ = auVar24._8_4_ * fVar46;
        auVar38._12_4_ = auVar24._12_4_ * fVar49;
        auVar78._0_4_ = fVar103 * auVar35._0_4_;
        auVar78._4_4_ = fVar52 * auVar35._4_4_;
        auVar78._8_4_ = fVar47 * auVar35._8_4_;
        auVar78._12_4_ = fVar50 * auVar35._12_4_;
        auVar35 = vfmsub213ps_fma(auVar35,auVar43,auVar38);
        auVar31 = vandps_avx(auVar33,auVar62);
        auVar61 = vandps_avx(auVar38,auVar62);
        auVar31 = vcmpps_avx(auVar31,auVar61,1);
        local_14d0 = vblendvps_avx(auVar35,auVar32,auVar31);
        auVar94._0_4_ = fVar42 * auVar55._0_4_;
        auVar94._4_4_ = fVar86 * auVar55._4_4_;
        auVar94._8_4_ = fVar48 * auVar55._8_4_;
        auVar94._12_4_ = fVar51 * auVar55._12_4_;
        auVar32 = vfmsub213ps_fma(auVar55,local_1560,auVar78);
        auVar39._0_4_ = local_1660._0_4_ * fVar93;
        auVar39._4_4_ = local_1660._4_4_ * fVar75;
        auVar39._8_4_ = local_1660._8_4_ * fVar46;
        auVar39._12_4_ = local_1660._12_4_ * fVar49;
        auVar35 = vfmsub213ps_fma(local_1670,local_1570,auVar39);
        auVar31 = vandps_avx(auVar39,auVar62);
        auVar61 = vandps_avx(auVar78,auVar62);
        auVar31 = vcmpps_avx(auVar31,auVar61,1);
        local_14c0 = vblendvps_avx(auVar32,auVar35,auVar31);
        auVar32 = vfmsub213ps_fma(local_1660,auVar43,auVar70);
        auVar24 = vfmsub213ps_fma(auVar24,local_1570,auVar94);
        auVar31 = vandps_avx(auVar70,auVar62);
        auVar61 = vandps_avx(auVar94,auVar62);
        auVar31 = vcmpps_avx(auVar31,auVar61,1);
        local_14b0 = vblendvps_avx(auVar24,auVar32,auVar31);
        auVar63._0_4_ = local_14b0._0_4_ * local_16b0._4_4_;
        auVar63._4_4_ = local_14b0._4_4_ * local_16b0._4_4_;
        auVar63._8_4_ = local_14b0._8_4_ * local_16b0._4_4_;
        auVar63._12_4_ = local_14b0._12_4_ * local_16b0._4_4_;
        auVar31 = vfmadd213ps_fma(auVar73,local_14c0,auVar63);
        auVar31 = vfmadd213ps_fma(auVar117,local_14d0,auVar31);
        auVar71._0_4_ = auVar31._0_4_ + auVar31._0_4_;
        auVar71._4_4_ = auVar31._4_4_ + auVar31._4_4_;
        auVar71._8_4_ = auVar31._8_4_ + auVar31._8_4_;
        auVar71._12_4_ = auVar31._12_4_ + auVar31._12_4_;
        auVar64._0_4_ = local_14b0._0_4_ * fVar113;
        auVar64._4_4_ = local_14b0._4_4_ * fVar114;
        auVar64._8_4_ = local_14b0._8_4_ * fVar115;
        auVar64._12_4_ = local_14b0._12_4_ * fVar116;
        auVar31 = vfmadd213ps_fma(local_1630,local_14c0,auVar64);
        auVar61 = vfmadd213ps_fma(local_1620,local_14d0,auVar31);
        auVar31 = vrcpps_avx(auVar71);
        auVar95._8_4_ = 0x3f800000;
        auVar95._0_8_ = 0x3f8000003f800000;
        auVar95._12_4_ = 0x3f800000;
        auVar32 = vfnmadd213ps_fma(auVar31,auVar71,auVar95);
        auVar31 = vfmadd132ps_fma(auVar32,auVar31,auVar31);
        local_14e0._0_4_ = auVar31._0_4_ * (auVar61._0_4_ + auVar61._0_4_);
        local_14e0._4_4_ = auVar31._4_4_ * (auVar61._4_4_ + auVar61._4_4_);
        local_14e0._8_4_ = auVar31._8_4_ * (auVar61._8_4_ + auVar61._8_4_);
        local_14e0._12_4_ = auVar31._12_4_ * (auVar61._12_4_ + auVar61._12_4_);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
        auVar79._4_4_ = uVar1;
        auVar79._0_4_ = uVar1;
        auVar79._8_4_ = uVar1;
        auVar79._12_4_ = uVar1;
        auVar31 = vcmpps_avx(auVar79,local_14e0,2);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar96._4_4_ = uVar1;
        auVar96._0_4_ = uVar1;
        auVar96._8_4_ = uVar1;
        auVar96._12_4_ = uVar1;
        auVar65 = ZEXT1664(auVar96);
        auVar61 = vcmpps_avx(local_14e0,auVar96,2);
        auVar31 = vandps_avx(auVar31,auVar61);
        auVar61 = local_16a0 & auVar31;
        if ((((auVar61 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar61 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar61 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar61[0xf] < '\0') {
          auVar31 = vandps_avx(auVar31,local_16a0);
          auVar61 = vcmpps_avx(auVar71,_DAT_01f45a50,4);
          local_1510 = vandps_avx(auVar31,auVar61);
          uVar12 = vmovmskps_avx(local_1510);
          if (uVar12 != 0) {
            lVar14 = lVar14 + uVar22;
            local_16b0 = lVar14;
            local_1520 = &local_16b9;
            auVar31 = vrcpps_avx(local_1530);
            auVar40._8_4_ = 0x3f800000;
            auVar40._0_8_ = 0x3f8000003f800000;
            auVar40._12_4_ = 0x3f800000;
            auVar61 = vfnmadd213ps_fma(local_1530,auVar31,auVar40);
            auVar61 = vfmadd132ps_fma(auVar61,auVar31,auVar31);
            auVar34._8_4_ = 0x219392ef;
            auVar34._0_8_ = 0x219392ef219392ef;
            auVar34._12_4_ = 0x219392ef;
            auVar31 = vcmpps_avx(local_1590,auVar34,5);
            auVar31 = vandps_avx(auVar31,auVar61);
            auVar28._0_4_ = local_1550 * auVar31._0_4_;
            auVar28._4_4_ = fStack_154c * auVar31._4_4_;
            auVar28._8_4_ = fStack_1548 * auVar31._8_4_;
            auVar28._12_4_ = fStack_1544 * auVar31._12_4_;
            local_1500 = vminps_avx(auVar28,auVar40);
            auVar29._0_4_ = local_1540._0_4_ * auVar31._0_4_;
            auVar29._4_4_ = local_1540._4_4_ * auVar31._4_4_;
            auVar29._8_4_ = local_1540._8_4_ * auVar31._8_4_;
            auVar29._12_4_ = local_1540._12_4_ * auVar31._12_4_;
            local_14f0 = vminps_avx(auVar29,auVar40);
            uVar13 = (ulong)(uVar12 & 0xff);
            uStack_1638 = auVar117._8_8_;
            local_1640 = context->scene;
            pSVar19 = context->scene;
            do {
              uVar17 = 0;
              for (uVar6 = uVar13; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
                uVar17 = uVar17 + 1;
              }
              uVar12 = *(uint *)(lVar14 + 0x90 + uVar17 * 4);
              pGVar16 = (pSVar19->geometries).items[uVar12].ptr;
              if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                local_16a0._0_8_ = uVar17;
                local_1620._0_8_ = uVar13;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_1630._0_8_ = pGVar16;
                  uVar13 = (ulong)(uint)((int)uVar17 * 4);
                  local_12c0 = *(undefined4 *)(local_1500 + uVar13);
                  local_12a0 = *(undefined4 *)(local_14f0 + uVar13);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_14e0 + uVar13);
                  local_15f0.context = context->user;
                  uVar1 = *(undefined4 *)(local_16b0 + 0xa0 + uVar13);
                  local_1280._4_4_ = uVar1;
                  local_1280._0_4_ = uVar1;
                  local_1280._8_4_ = uVar1;
                  local_1280._12_4_ = uVar1;
                  local_1280._16_4_ = uVar1;
                  local_1280._20_4_ = uVar1;
                  local_1280._24_4_ = uVar1;
                  local_1280._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)(local_14d0 + uVar13);
                  uVar2 = *(undefined4 *)(local_14c0 + uVar13);
                  local_1300._4_4_ = uVar2;
                  local_1300._0_4_ = uVar2;
                  local_1300._8_4_ = uVar2;
                  local_1300._12_4_ = uVar2;
                  local_1300._16_4_ = uVar2;
                  local_1300._20_4_ = uVar2;
                  local_1300._24_4_ = uVar2;
                  local_1300._28_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_14b0 + uVar13);
                  local_12e0._4_4_ = uVar2;
                  local_12e0._0_4_ = uVar2;
                  local_12e0._8_4_ = uVar2;
                  local_12e0._12_4_ = uVar2;
                  local_12e0._16_4_ = uVar2;
                  local_12e0._20_4_ = uVar2;
                  local_12e0._24_4_ = uVar2;
                  local_12e0._28_4_ = uVar2;
                  local_1260._4_4_ = uVar12;
                  local_1260._0_4_ = uVar12;
                  local_1260._8_4_ = uVar12;
                  local_1260._12_4_ = uVar12;
                  local_1260._16_4_ = uVar12;
                  local_1260._20_4_ = uVar12;
                  local_1260._24_4_ = uVar12;
                  local_1260._28_4_ = uVar12;
                  local_1320[0] = (RTCHitN)(char)uVar1;
                  local_1320[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[4] = (RTCHitN)(char)uVar1;
                  local_1320[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[8] = (RTCHitN)(char)uVar1;
                  local_1320[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[0xc] = (RTCHitN)(char)uVar1;
                  local_1320[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[0x10] = (RTCHitN)(char)uVar1;
                  local_1320[0x11] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[0x12] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0x13] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[0x14] = (RTCHitN)(char)uVar1;
                  local_1320[0x15] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[0x16] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0x17] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[0x18] = (RTCHitN)(char)uVar1;
                  local_1320[0x19] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[0x1a] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0x1b] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[0x1c] = (RTCHitN)(char)uVar1;
                  local_1320[0x1d] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[0x1e] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0x1f] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  uStack_12bc = local_12c0;
                  uStack_12b8 = local_12c0;
                  uStack_12b4 = local_12c0;
                  uStack_12b0 = local_12c0;
                  uStack_12ac = local_12c0;
                  uStack_12a8 = local_12c0;
                  uStack_12a4 = local_12c0;
                  uStack_129c = local_12a0;
                  uStack_1298 = local_12a0;
                  uStack_1294 = local_12a0;
                  uStack_1290 = local_12a0;
                  uStack_128c = local_12a0;
                  uStack_1288 = local_12a0;
                  uStack_1284 = local_12a0;
                  auVar30 = vpcmpeqd_avx2(local_1260,local_1260);
                  uStack_123c = (local_15f0.context)->instID[0];
                  local_1240 = uStack_123c;
                  uStack_1238 = uStack_123c;
                  uStack_1234 = uStack_123c;
                  uStack_1230 = uStack_123c;
                  uStack_122c = uStack_123c;
                  uStack_1228 = uStack_123c;
                  uStack_1224 = uStack_123c;
                  uStack_121c = (local_15f0.context)->instPrimID[0];
                  local_1220 = uStack_121c;
                  uStack_1218 = uStack_121c;
                  uStack_1214 = uStack_121c;
                  uStack_1210 = uStack_121c;
                  uStack_120c = uStack_121c;
                  uStack_1208 = uStack_121c;
                  uStack_1204 = uStack_121c;
                  local_15c0 = local_14a0;
                  local_15f0.valid = (int *)local_15c0;
                  local_15f0.geometryUserPtr = pGVar16->userPtr;
                  local_15f0.hit = local_1320;
                  local_15f0.N = 8;
                  local_15f0.ray = (RTCRayN *)ray;
                  if (pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    local_1660._0_8_ = k;
                    local_1650._0_8_ = ray;
                    local_1670._0_8_ = puVar18;
                    local_1680._0_8_ = uVar20;
                    local_1690 = auVar65._0_16_;
                    auVar30 = ZEXT1632(auVar30._0_16_);
                    (*pGVar16->occlusionFilterN)(&local_15f0);
                    auVar65 = ZEXT1664(local_1690);
                    auVar30 = vpcmpeqd_avx2(auVar30,auVar30);
                    k = local_1660._0_8_;
                    pGVar16 = (Geometry *)local_1630._0_8_;
                    puVar18 = (ulong *)local_1670._0_8_;
                    ray = (RayK<8> *)local_1650._0_8_;
                    uVar20 = local_1680._0_8_;
                  }
                  auVar4 = vpcmpeqd_avx2(local_15c0,_DAT_01f7b000);
                  auVar5 = auVar30 & ~auVar4;
                  if ((((((((auVar5 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar5 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar5 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar5 >> 0x7f,0) == '\0') &&
                        (auVar5 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar5 >> 0xbf,0) == '\0') &&
                      (auVar5 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar5[0x1f]) {
                    auVar4 = auVar4 ^ auVar30;
                  }
                  else {
                    p_Var3 = context->args->filter;
                    if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar16->field_8).field_0x2 & 0x40) != 0)))) {
                      local_1660._0_8_ = k;
                      local_1650._0_8_ = ray;
                      local_1670._0_8_ = puVar18;
                      local_1680._0_8_ = uVar20;
                      local_1690 = auVar65._0_16_;
                      auVar30 = ZEXT1632(auVar30._0_16_);
                      (*p_Var3)(&local_15f0);
                      auVar65 = ZEXT1664(local_1690);
                      auVar30 = vpcmpeqd_avx2(auVar30,auVar30);
                      k = local_1660._0_8_;
                      puVar18 = (ulong *)local_1670._0_8_;
                      ray = (RayK<8> *)local_1650._0_8_;
                      uVar20 = local_1680._0_8_;
                    }
                    auVar5 = vpcmpeqd_avx2(local_15c0,_DAT_01f7b000);
                    auVar4 = auVar5 ^ auVar30;
                    auVar41._8_4_ = 0xff800000;
                    auVar41._0_8_ = 0xff800000ff800000;
                    auVar41._12_4_ = 0xff800000;
                    auVar41._16_4_ = 0xff800000;
                    auVar41._20_4_ = 0xff800000;
                    auVar41._24_4_ = 0xff800000;
                    auVar41._28_4_ = 0xff800000;
                    auVar30 = vblendvps_avx(auVar41,*(undefined1 (*) [32])(local_15f0.ray + 0x100),
                                            auVar5);
                    *(undefined1 (*) [32])(local_15f0.ray + 0x100) = auVar30;
                  }
                  if ((((((((auVar4 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar4 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar4 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar4 >> 0x7f,0) == '\0') &&
                        (auVar4 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar4 >> 0xbf,0) == '\0') &&
                      (auVar4 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar4[0x1f]) {
                    *(int *)(ray + k * 4 + 0x100) = auVar65._0_4_;
                    uVar13 = local_1620._0_8_ ^ 1L << (local_16a0._0_8_ & 0x3f);
                    lVar14 = local_16b0;
                    goto LAB_016c6bab;
                  }
                }
                *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                goto LAB_016c6d23;
              }
              uVar13 = uVar13 ^ 1L << (uVar17 & 0x3f);
              lVar14 = local_16b0;
LAB_016c6bab:
              pSVar19 = local_1640;
            } while (uVar13 != 0);
          }
        }
      }
      auVar65 = ZEXT3264(local_1340);
      auVar72 = ZEXT3264(local_1360);
      auVar74 = ZEXT3264(local_1380);
      auVar110 = ZEXT3264(local_1460);
      auVar112 = ZEXT3264(local_1480);
      fVar42 = local_1440;
      fVar46 = fStack_143c;
      fVar47 = fStack_1438;
      fVar48 = fStack_1434;
      fVar49 = fStack_1430;
      fVar50 = fStack_142c;
      fVar51 = fStack_1428;
      fVar52 = local_13c0;
      fVar113 = fStack_13bc;
      fVar114 = fStack_13b8;
      fVar115 = fStack_13b4;
      fVar116 = fStack_13b0;
      fVar58 = fStack_13ac;
      fVar59 = fStack_13a8;
      fVar75 = local_13a0;
      fVar80 = fStack_139c;
      fVar81 = fStack_1398;
      fVar82 = fStack_1394;
      fVar83 = fStack_1390;
      fVar84 = fStack_138c;
      fVar85 = fStack_1388;
      fVar86 = local_13e0;
      fVar87 = fStack_13dc;
      fVar88 = fStack_13d8;
      fVar89 = fStack_13d4;
      fVar90 = fStack_13d0;
      fVar91 = fStack_13cc;
      fVar92 = fStack_13c8;
      fVar93 = local_1400;
      fVar97 = fStack_13fc;
      fVar98 = fStack_13f8;
      fVar99 = fStack_13f4;
      fVar100 = fStack_13f0;
      fVar101 = fStack_13ec;
      fVar102 = fStack_13e8;
      fVar103 = local_1420;
      fVar104 = fStack_141c;
      fVar105 = fStack_1418;
      fVar106 = fStack_1414;
      fVar107 = fStack_1410;
      fVar108 = fStack_140c;
      fVar109 = fStack_1408;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }